

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_io.c
# Opt level: O2

ALLEGRO_AUDIO_STREAM * al_load_audio_stream(char *filename,size_t buffer_count,uint samples)

{
  char cVar1;
  char *ext;
  ACODEC_TABLE *pAVar2;
  ALLEGRO_AUDIO_STREAM *pAVar3;
  
  ext = strrchr(filename,0x2e);
  if (ext == (char *)0x0) {
    cVar1 = _al_trace_prefix("audio",3,
                             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/audio_io.c"
                             ,0x135,"al_load_audio_stream");
    if (cVar1 != '\0') {
      _al_trace_suffix("Unable to determine extension for %s.\n",filename);
    }
  }
  else {
    pAVar2 = find_acodec_table_entry(ext);
    if ((pAVar2 != (ACODEC_TABLE *)0x0) &&
       (pAVar2->stream_loader != (_func_ALLEGRO_AUDIO_STREAM_ptr_char_ptr_size_t_uint *)0x0)) {
      pAVar3 = (*pAVar2->stream_loader)(filename,buffer_count,samples);
      return pAVar3;
    }
    cVar1 = _al_trace_prefix("audio",3,
                             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/audio_io.c"
                             ,0x13e,"al_load_audio_stream");
    if (cVar1 != '\0') {
      _al_trace_suffix("No handler for audio file extension %s - therefore not trying to load %s.\n"
                       ,ext,filename);
    }
  }
  return (ALLEGRO_AUDIO_STREAM *)0x0;
}

Assistant:

ALLEGRO_AUDIO_STREAM *al_load_audio_stream(const char *filename,
   size_t buffer_count, unsigned int samples)
{
   const char *ext;
   ACODEC_TABLE *ent;

   ASSERT(filename);
   ext = strrchr(filename, '.');
   if (ext == NULL) {
      ALLEGRO_ERROR("Unable to determine extension for %s.\n", filename);
      return NULL;
   }

   ent = find_acodec_table_entry(ext);
   if (ent && ent->stream_loader) {
      return (ent->stream_loader)(filename, buffer_count, samples);
   }
   else {
      ALLEGRO_ERROR("No handler for audio file extension %s - "
         "therefore not trying to load %s.\n", ext, filename);
   }

   return NULL;
}